

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

int internal_device_stop(AMQP_DEVICE_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  AMQP_DEVICE_INSTANCE_conflict *instance_local;
  
  if (((instance->msgr_state == TELEMETRY_MESSENGER_STATE_STOPPED) ||
      (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STOPPING)) ||
     (iVar1 = telemetry_messenger_stop(instance->messenger_handle), iVar1 == 0)) {
    if (((instance->twin_msgr_state == TWIN_MESSENGER_STATE_STOPPED) ||
        (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STOPPING)) ||
       (iVar1 = twin_messenger_stop(instance->twin_messenger_handle), iVar1 == 0)) {
      if (((instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS) &&
          (instance->auth_state != AUTHENTICATION_STATE_STOPPED)) &&
         (iVar1 = authentication_stop(instance->authentication_handle), iVar1 != 0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"internal_device_stop",0x34a,1,
                    "Failed stopping device \'%s\' (authentication_stop failed)",
                    instance->config->device_id);
        }
        update_state(instance,DEVICE_STATE_ERROR_AUTH);
        l._4_4_ = 0x34c;
      }
      else {
        update_state(instance,DEVICE_STATE_STOPPED);
        l._4_4_ = 0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"internal_device_stop",0x342,1,
                  "Failed stopping device \'%s\' (twin_messenger_stop failed)",
                  instance->config->device_id);
      }
      update_state(instance,DEVICE_STATE_ERROR_MSG);
      l._4_4_ = 0x344;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"internal_device_stop",0x33a,1,
                "Failed stopping device \'%s\' (telemetry_messenger_stop failed)",
                instance->config->device_id);
    }
    update_state(instance,DEVICE_STATE_ERROR_MSG);
    l._4_4_ = 0x33c;
  }
  return l._4_4_;
}

Assistant:

static int internal_device_stop(AMQP_DEVICE_INSTANCE* instance)
{
    int result;

    if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPED &&
        instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPING &&
        telemetry_messenger_stop(instance->messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (telemetry_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPED &&
        instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPING &&
        twin_messenger_stop(instance->twin_messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (twin_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS &&
        instance->auth_state != AUTHENTICATION_STATE_STOPPED &&
        authentication_stop(instance->authentication_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (authentication_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_AUTH);
        result = MU_FAILURE;
    }
    else
    {
        update_state(instance, DEVICE_STATE_STOPPED);
        result = RESULT_OK;
    }

    return result;
}